

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O0

void __thiscall Block::Block(Block *this,int id,int row,int column,int length,char direction)

{
  char direction_local;
  int length_local;
  int column_local;
  int row_local;
  int id_local;
  Block *this_local;
  
  this->row = row;
  this->column = column;
  this->length = length;
  this->direction = (int)direction;
  this->id = id;
  this->row = row;
  this->column = column;
  this->length = length;
  if (direction == 'h') {
    this->direction = 0;
  }
  else {
    this->direction = 1;
  }
  return;
}

Assistant:

Block::Block(int id, int row, int column, int length, char direction) : row(row), column(column), length(length),
                                                                        direction(direction) {
    this->id = id;
    this->row = row;
    this->column = column;
    this->length = length;

    if (direction == 'h') {
        this->direction = HORIZONTAL;
    } else {
        this->direction = VERTICAL;
    }
}